

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O3

string * __thiscall
PathNode::Evaluate(string *__return_storage_ptr__,PathNode *this,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *parameters,cmGeneratorExpressionContext *context,
                  GeneratorExpressionContent *content,cmGeneratorExpressionDAGChecker *param_4)

{
  pointer pbVar1;
  pointer pcVar2;
  int iVar3;
  key_type *pkVar4;
  __node_ptr p_Var5;
  __node_ptr __code;
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  long lVar6;
  code *__n_elt;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>_>
  __l;
  Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  _Alloc_hider in_stack_fffffffffffffa48;
  _Alloc_hider _Var7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5a8;
  string local_598;
  GeneratorExpressionContent *local_578;
  undefined1 local_570 [40];
  code *local_548;
  __node_base_ptr local_540;
  char *local_538;
  undefined8 local_530;
  undefined8 uStack_528;
  code *local_520;
  code *local_518;
  undefined8 local_510;
  char *local_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  code *local_4f0;
  code *local_4e8;
  undefined8 local_4e0;
  char *local_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  code *local_4c0;
  code *local_4b8;
  undefined8 local_4b0;
  char *local_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  code *local_490;
  code *local_488;
  undefined8 local_480;
  char *local_478;
  undefined8 local_470;
  undefined8 uStack_468;
  code *local_460;
  code *local_458;
  undefined8 local_450;
  char *local_448;
  undefined8 local_440;
  undefined8 uStack_438;
  code *local_430;
  code *local_428;
  undefined8 local_420;
  char *local_418;
  undefined8 local_410;
  undefined8 uStack_408;
  code *local_400;
  code *local_3f8;
  undefined8 local_3f0;
  char *local_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  code *local_3d0;
  code *local_3c8;
  undefined8 local_3c0;
  char *local_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  code *local_3a0;
  code *local_398;
  undefined8 local_390;
  char *local_388;
  undefined8 local_380;
  undefined8 uStack_378;
  code *local_370;
  code *local_368;
  undefined8 local_360;
  char *local_358;
  undefined8 local_350;
  undefined8 uStack_348;
  code *local_340;
  code *local_338;
  undefined8 local_330;
  char *local_328;
  undefined8 local_320;
  undefined8 uStack_318;
  code *local_310;
  code *local_308;
  undefined8 local_300;
  char *local_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  code *local_2e0;
  code *local_2d8;
  undefined8 local_2d0;
  char *local_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  code *local_2b0;
  code *local_2a8;
  undefined8 local_2a0;
  char *local_298;
  undefined8 local_290;
  undefined8 uStack_288;
  code *local_280;
  code *local_278;
  undefined8 local_270;
  char *local_268;
  undefined8 local_260;
  undefined8 uStack_258;
  code *local_250;
  code *local_248;
  undefined8 local_240;
  char *local_238;
  undefined8 local_230;
  undefined8 uStack_228;
  code *local_220;
  code *local_218;
  undefined8 local_210;
  char *local_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  code *local_1f0;
  code *local_1e8;
  undefined8 local_1e0;
  char *local_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  code *local_1c0;
  code *local_1b8;
  undefined8 local_1b0;
  char *local_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  code *local_190;
  code *local_188;
  undefined8 local_180;
  char *local_178;
  undefined8 local_170;
  undefined8 uStack_168;
  code *local_160;
  code *local_158;
  undefined8 local_150;
  char *local_148;
  undefined8 local_140;
  undefined8 uStack_138;
  code *local_130;
  code *local_128;
  undefined8 local_120;
  char *local_118;
  undefined8 local_110;
  undefined8 uStack_108;
  code *local_100;
  code *local_f8;
  undefined8 local_f0;
  char *local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  code *local_d0;
  code *local_c8;
  undefined8 local_c0;
  char *local_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  code *local_a0;
  code *local_98;
  undefined8 local_90;
  char *local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  code *local_70;
  code *local_68;
  undefined8 local_60;
  char *local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  code *local_40 [2];
  
  __n_elt = (code *)content;
  if (Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
      ::pathCommands_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                                 ::pathCommands_abi_cxx11_);
    if (iVar3 != 0) {
      local_570._0_8_ = (__buckets_ptr)0xd;
      local_570._8_8_ = "GET_ROOT_NAME";
      local_570._16_8_ = (_Hash_node_base *)0x0;
      local_570._24_8_ = 0;
      local_548 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:696:11)>
                  ::_M_invoke;
      local_570._32_8_ =
           std::
           _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:696:11)>
           ::_M_manager;
      local_540 = (__node_base_ptr)0x12;
      local_538 = "GET_ROOT_DIRECTORY";
      local_530 = 0;
      uStack_528 = 0;
      local_518 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:705:11)>
                  ::_M_invoke;
      local_520 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:705:11)>
                  ::_M_manager;
      local_510 = 0xd;
      local_508 = "GET_ROOT_PATH";
      local_500 = 0;
      uStack_4f8 = 0;
      local_4e8 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:715:11)>
                  ::_M_invoke;
      local_4f0 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:715:11)>
                  ::_M_manager;
      local_4e0 = 0xc;
      local_4d8 = "GET_FILENAME";
      local_4d0 = 0;
      uStack_4c8 = 0;
      local_4b8 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:724:11)>
                  ::_M_invoke;
      local_4c0 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:724:11)>
                  ::_M_manager;
      local_4b0 = 0xd;
      local_4a8 = "GET_EXTENSION";
      local_4a0 = 0;
      uStack_498 = 0;
      local_488 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:733:11)>
                  ::_M_invoke;
      local_490 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:733:11)>
                  ::_M_manager;
      local_480 = 8;
      local_478 = "GET_STEM";
      local_470 = 0;
      uStack_468 = 0;
      local_458 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:754:11)>
                  ::_M_invoke;
      local_460 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:754:11)>
                  ::_M_manager;
      local_450 = 0x11;
      local_448 = "GET_RELATIVE_PART";
      local_440 = 0;
      uStack_438 = 0;
      local_428 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:774:11)>
                  ::_M_invoke;
      local_430 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:774:11)>
                  ::_M_manager;
      local_420 = 0xf;
      local_418 = "GET_PARENT_PATH";
      local_410 = 0;
      uStack_408 = 0;
      local_3f8 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:784:11)>
                  ::_M_invoke;
      local_400 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:784:11)>
                  ::_M_manager;
      local_3f0 = 0xd;
      local_3e8 = "HAS_ROOT_NAME";
      local_3e0 = 0;
      uStack_3d8 = 0;
      local_3c8 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:792:11)>
                  ::_M_invoke;
      local_3d0 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:792:11)>
                  ::_M_manager;
      local_3c0 = 0x12;
      local_3b8 = "HAS_ROOT_DIRECTORY";
      local_3b0 = 0;
      uStack_3a8 = 0;
      local_398 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:800:11)>
                  ::_M_invoke;
      local_3a0 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:800:11)>
                  ::_M_manager;
      local_390 = 0xd;
      local_388 = "HAS_ROOT_PATH";
      local_380 = 0;
      uStack_378 = 0;
      local_368 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:808:11)>
                  ::_M_invoke;
      local_370 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:808:11)>
                  ::_M_manager;
      local_360 = 0xc;
      local_358 = "HAS_FILENAME";
      local_350 = 0;
      uStack_348 = 0;
      local_338 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:816:11)>
                  ::_M_invoke;
      local_340 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:816:11)>
                  ::_M_manager;
      local_330 = 0xd;
      local_328 = "HAS_EXTENSION";
      local_320 = 0;
      uStack_318 = 0;
      local_308 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:824:11)>
                  ::_M_invoke;
      local_310 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:824:11)>
                  ::_M_manager;
      local_300 = 8;
      local_2f8 = "HAS_STEM";
      local_2f0 = 0;
      uStack_2e8 = 0;
      local_2d8 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:833:11)>
                  ::_M_invoke;
      local_2e0 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:833:11)>
                  ::_M_manager;
      local_2d0 = 0x11;
      local_2c8 = "HAS_RELATIVE_PART";
      local_2c0 = 0;
      uStack_2b8 = 0;
      local_2a8 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:841:11)>
                  ::_M_invoke;
      local_2b0 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:841:11)>
                  ::_M_manager;
      local_2a0 = 0xf;
      local_298 = "HAS_PARENT_PATH";
      local_290 = 0;
      uStack_288 = 0;
      local_278 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:849:11)>
                  ::_M_invoke;
      local_280 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:849:11)>
                  ::_M_manager;
      local_270 = 0xb;
      local_268 = "IS_ABSOLUTE";
      local_260 = 0;
      uStack_258 = 0;
      local_248 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:857:11)>
                  ::_M_invoke;
      local_250 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:857:11)>
                  ::_M_manager;
      local_240 = 0xb;
      local_238 = "IS_RELATIVE";
      local_230 = 0;
      uStack_228 = 0;
      local_218 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:865:11)>
                  ::_M_invoke;
      local_220 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:865:11)>
                  ::_M_manager;
      local_210 = 9;
      local_208 = "IS_PREFIX";
      local_200 = 0;
      uStack_1f8 = 0;
      local_1e8 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:873:11)>
                  ::_M_invoke;
      local_1f0 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:873:11)>
                  ::_M_manager;
      local_1e0 = 10;
      local_1d8 = "CMAKE_PATH";
      local_1d0 = 0;
      uStack_1c8 = 0;
      local_1b8 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:894:11)>
                  ::_M_invoke;
      local_1c0 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:894:11)>
                  ::_M_manager;
      local_1b0 = 6;
      local_1a8 = "APPEND";
      local_1a0 = 0;
      uStack_198 = 0;
      local_188 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:913:11)>
                  ::_M_invoke;
      local_190 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:913:11)>
                  ::_M_manager;
      local_180 = 0xf;
      local_178 = "REMOVE_FILENAME";
      local_170 = 0;
      uStack_168 = 0;
      local_158 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:927:11)>
                  ::_M_invoke;
      local_160 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:927:11)>
                  ::_M_manager;
      local_150 = 0x10;
      local_148 = "REPLACE_FILENAME";
      local_140 = 0;
      uStack_138 = 0;
      local_128 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:936:11)>
                  ::_M_invoke;
      __n_elt = std::
                _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:936:11)>
                ::_M_manager;
      local_130 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:936:11)>
                  ::_M_manager;
      local_120 = 0x10;
      local_118 = "REMOVE_EXTENSION";
      local_110 = 0;
      uStack_108 = 0;
      local_f8 = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:946:11)>
                 ::_M_invoke;
      local_100 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:946:11)>
                  ::_M_manager;
      local_f0 = 0x11;
      local_e8 = "REPLACE_EXTENSION";
      local_e0 = 0;
      uStack_d8 = 0;
      local_c8 = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:967:11)>
                 ::_M_invoke;
      local_d0 = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:967:11)>
                 ::_M_manager;
      local_c0 = 0xb;
      local_b8 = "NORMAL_PATH";
      local_b0 = 0;
      uStack_a8 = 0;
      local_98 = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:991:11)>
                 ::_M_invoke;
      local_a0 = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:991:11)>
                 ::_M_manager;
      local_90 = 0xd;
      local_88 = "RELATIVE_PATH";
      local_80 = 0;
      uStack_78 = 0;
      local_68 = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:1000:11)>
                 ::_M_invoke;
      local_70 = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:1000:11)>
                 ::_M_manager;
      local_60 = 0xd;
      local_58 = "ABSOLUTE_PATH";
      local_50 = 0;
      uStack_48 = 0;
      local_40[1] = std::
                    _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:1008:11)>
                    ::_M_invoke;
      local_40[0] = std::
                    _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:1008:11)>
                    ::_M_manager;
      __l._M_len = (size_type)
                   std::
                   _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:946:11)>
                   ::_M_manager;
      __l._M_array = (iterator)0xb;
      std::
      unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>_>_>
      ::unordered_map((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>_>_>
                       *)local_570,__l,0x4d7f46,
                      (hasher *)
                      std::
                      _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx:936:11)>
                      ::_M_manager,(key_equal *)0x8,(allocator_type *)in_stack_fffffffffffffa48._M_p
                     );
      lVar6 = 0;
      do {
        if (*(code **)((long)local_40 + lVar6) != (code *)0x0) {
          (**(code **)((long)local_40 + lVar6))((long)&local_50 + lVar6,(long)&local_50 + lVar6,3);
        }
        lVar6 = lVar6 + -0x30;
      } while (lVar6 != -0x540);
      __cxa_atexit(std::
                   unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>_>_>
                   ::~unordered_map,
                   &Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                    ::pathCommands_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                           ::pathCommands_abi_cxx11_);
    }
  }
  pbVar1 = (parameters->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_570._8_8_ = (pbVar1->_M_dataplus)._M_p;
  local_570._0_8_ = pbVar1->_M_string_length;
  pkVar4 = (key_type *)std::_Hash_bytes((void *)local_570._8_8_,local_570._0_8_,0xc70f6907);
  p_Var5 = std::
           _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)((ulong)pkVar4 %
                             Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                             ::pathCommands_abi_cxx11_._M_h._M_bucket_count),(size_type)local_570,
                          pkVar4,(__hash_code)pkVar4);
  if (p_Var5 == (__node_ptr)0x0) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              ((string *)&stack0xfffffffffffffa48,content);
    pbVar1 = (parameters->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_570._8_8_ = (pbVar1->_M_dataplus)._M_p;
    local_570._0_8_ = pbVar1->_M_string_length;
    local_570._16_8_ = &DAT_00000011;
    local_570._24_8_ = ": invalid option.";
    views._M_len = 2;
    views._M_array = (iterator)local_570;
    cmCatViews_abi_cxx11_(&local_598,views);
    reportError(context,(string *)&stack0xfffffffffffffa48,&local_598);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_598._M_dataplus._M_p != &local_598.field_2) {
      operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_fffffffffffffa48._M_p != &local_5a8) {
      operator_delete(in_stack_fffffffffffffa48._M_p,local_5a8._M_allocated_capacity + 1);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    pbVar1 = (parameters->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    p_Var5 = (__node_ptr)
             (parameters->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    local_570._0_8_ = pbVar1 + 1;
    pcVar2 = (pbVar1->_M_dataplus)._M_p;
    _Var7._M_p = (pointer)pbVar1->_M_string_length;
    local_570._8_8_ = p_Var5;
    pkVar4 = (key_type *)std::_Hash_bytes(pcVar2,(ulong)_Var7._M_p,0xc70f6907);
    this_00 = (_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)((ulong)pkVar4 %
                 Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                 ::pathCommands_abi_cxx11_._M_h._M_bucket_count);
    __code = std::
             _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::_M_find_node(this_00,(size_type)&stack0xfffffffffffffa48,pkVar4,(__hash_code)p_Var5);
    if (__code == (__node_ptr)0x0) {
      __code = (__node_ptr)operator_new(0x40);
      (__code->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
      (__code->
      super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>,_true>
      ).
      super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>_>
      ._M_storage._M_storage.__align = (anon_struct_8_0_00000001_for___align)_Var7._M_p;
      *(pointer *)
       ((long)&(__code->
               super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>_>
               ._M_storage._M_storage + 8) = pcVar2;
      *(undefined8 *)
       ((long)&(__code->
               super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>_>
               ._M_storage._M_storage + 0x20) = 0;
      *(undefined8 *)
       ((long)&(__code->
               super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>_>
               ._M_storage._M_storage + 0x28) = 0;
      *(undefined8 *)
       ((long)&(__code->
               super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>_>
               ._M_storage._M_storage + 0x10) = 0;
      *(undefined8 *)
       ((long)&(__code->
               super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>_>
               ._M_storage._M_storage + 0x18) = 0;
      std::
      _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_insert_unique_node
                (this_00,(size_type)pkVar4,(__hash_code)__code,p_Var5,(size_type)__n_elt);
    }
    local_598._M_dataplus._M_p = (pointer)context;
    local_578 = content;
    if (*(long *)((long)&(__code->
                         super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>,_true>
                         ).
                         super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>_>
                         ._M_storage._M_storage + 0x20) == 0) {
      std::__throw_bad_function_call();
    }
    (**(code **)((long)&(__code->
                        super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>,_true>
                        ).
                        super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>_>
                        ._M_storage._M_storage + 0x28))
              (__return_storage_ptr__,
               (undefined1 *)
               ((long)&(__code->
                       super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>,_true>
                       ).
                       super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>_>
                       ._M_storage._M_storage + 0x10),&local_598,&local_578,local_570);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* /*dagChecker*/) const override
  {
    static std::unordered_map<
      cm::string_view,
      std::function<std::string(cmGeneratorExpressionContext*,
                                const GeneratorExpressionContent*,
                                Arguments&)>>
      pathCommands{
        { "GET_ROOT_NAME"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            return CheckPathParameters(ctx, cnt, "GET_ROOT_NAME"_s, args) &&
                !args.front().empty()
              ? cmCMakePath{ args.front() }.GetRootName().String()
              : std::string{};
          } },
        { "GET_ROOT_DIRECTORY"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            return CheckPathParameters(ctx, cnt, "GET_ROOT_DIRECTORY"_s,
                                       args) &&
                !args.front().empty()
              ? cmCMakePath{ args.front() }.GetRootDirectory().String()
              : std::string{};
          } },
        { "GET_ROOT_PATH"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            return CheckPathParameters(ctx, cnt, "GET_ROOT_PATH"_s, args) &&
                !args.front().empty()
              ? cmCMakePath{ args.front() }.GetRootPath().String()
              : std::string{};
          } },
        { "GET_FILENAME"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            return CheckPathParameters(ctx, cnt, "GET_FILENAME"_s, args) &&
                !args.front().empty()
              ? cmCMakePath{ args.front() }.GetFileName().String()
              : std::string{};
          } },
        { "GET_EXTENSION"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            bool lastOnly = args.front() == "LAST_ONLY"_s;
            if (lastOnly) {
              args.advance(1);
            }
            if (CheckPathParametersEx(ctx, cnt,
                                      lastOnly ? "GET_EXTENSION,LAST_ONLY"_s
                                               : "GET_EXTENSION"_s,
                                      args.size())) {
              if (args.front().empty()) {
                return std::string{};
              }
              return lastOnly
                ? cmCMakePath{ args.front() }.GetExtension().String()
                : cmCMakePath{ args.front() }.GetWideExtension().String();
            }
            return std::string{};
          } },
        { "GET_STEM"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            bool lastOnly = args.front() == "LAST_ONLY"_s;
            if (lastOnly) {
              args.advance(1);
            }
            if (CheckPathParametersEx(
                  ctx, cnt, lastOnly ? "GET_STEM,LAST_ONLY"_s : "GET_STEM"_s,
                  args.size())) {
              if (args.front().empty()) {
                return std::string{};
              }
              return lastOnly
                ? cmCMakePath{ args.front() }.GetStem().String()
                : cmCMakePath{ args.front() }.GetNarrowStem().String();
            }
            return std::string{};
          } },
        { "GET_RELATIVE_PART"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            return CheckPathParameters(ctx, cnt, "GET_RELATIVE_PART"_s,
                                       args) &&
                !args.front().empty()
              ? cmCMakePath{ args.front() }.GetRelativePath().String()
              : std::string{};
          } },
        { "GET_PARENT_PATH"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            return CheckPathParameters(ctx, cnt, "GET_PARENT_PATH"_s, args)
              ? cmCMakePath{ args.front() }.GetParentPath().String()
              : std::string{};
          } },
        { "HAS_ROOT_NAME"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            return CheckPathParameters(ctx, cnt, "HAS_ROOT_NAME"_s, args)
              ? ToString(cmCMakePath{ args.front() }.HasRootName())
              : std::string{ "0" };
          } },
        { "HAS_ROOT_DIRECTORY"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            return CheckPathParameters(ctx, cnt, "HAS_ROOT_DIRECTORY"_s, args)
              ? ToString(cmCMakePath{ args.front() }.HasRootDirectory())
              : std::string{ "0" };
          } },
        { "HAS_ROOT_PATH"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            return CheckPathParameters(ctx, cnt, "HAS_ROOT_PATH"_s, args)
              ? ToString(cmCMakePath{ args.front() }.HasRootPath())
              : std::string{ "0" };
          } },
        { "HAS_FILENAME"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            return CheckPathParameters(ctx, cnt, "HAS_FILENAME"_s, args)
              ? ToString(cmCMakePath{ args.front() }.HasFileName())
              : std::string{ "0" };
          } },
        { "HAS_EXTENSION"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            return CheckPathParameters(ctx, cnt, "HAS_EXTENSION"_s, args) &&
                !args.front().empty()
              ? ToString(cmCMakePath{ args.front() }.HasExtension())
              : std::string{ "0" };
          } },
        { "HAS_STEM"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            return CheckPathParameters(ctx, cnt, "HAS_STEM"_s, args)
              ? ToString(cmCMakePath{ args.front() }.HasStem())
              : std::string{ "0" };
          } },
        { "HAS_RELATIVE_PART"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            return CheckPathParameters(ctx, cnt, "HAS_RELATIVE_PART"_s, args)
              ? ToString(cmCMakePath{ args.front() }.HasRelativePath())
              : std::string{ "0" };
          } },
        { "HAS_PARENT_PATH"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            return CheckPathParameters(ctx, cnt, "HAS_PARENT_PATH"_s, args)
              ? ToString(cmCMakePath{ args.front() }.HasParentPath())
              : std::string{ "0" };
          } },
        { "IS_ABSOLUTE"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            return CheckPathParameters(ctx, cnt, "IS_ABSOLUTE"_s, args)
              ? ToString(cmCMakePath{ args.front() }.IsAbsolute())
              : std::string{ "0" };
          } },
        { "IS_RELATIVE"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            return CheckPathParameters(ctx, cnt, "IS_RELATIVE"_s, args)
              ? ToString(cmCMakePath{ args.front() }.IsRelative())
              : std::string{ "0" };
          } },
        { "IS_PREFIX"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            bool normalize = args.front() == "NORMALIZE"_s;
            if (normalize) {
              args.advance(1);
            }
            if (CheckPathParametersEx(ctx, cnt,
                                      normalize ? "IS_PREFIX,NORMALIZE"_s
                                                : "IS_PREFIX"_s,
                                      args.size(), 2)) {
              if (normalize) {
                return ToString(cmCMakePath{ args[0] }.Normal().IsPrefix(
                  cmCMakePath{ args[1] }.Normal()));
              }
              return ToString(
                cmCMakePath{ args[0] }.IsPrefix(cmCMakePath{ args[1] }));
            }
            return std::string{};
          } },
        { "CMAKE_PATH"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            bool normalize = args.front() == "NORMALIZE"_s;
            if (normalize) {
              args.advance(1);
            }
            if (CheckPathParametersEx(ctx, cnt,
                                      normalize ? "CMAKE_PATH,NORMALIZE"_s
                                                : "CMAKE_PATH"_s,
                                      args.size(), 1)) {
              auto path =
                cmCMakePath{ args.front(), cmCMakePath::auto_format };
              return normalize ? path.Normal().GenericString()
                               : path.GenericString();
            }
            return std::string{};
          } },
        { "APPEND"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            if (CheckPathParametersEx(ctx, cnt, "APPEND"_s, args.size(), 1,
                                      false)) {
              cmCMakePath path;
              for (const auto& p : args) {
                path /= p;
              }
              return path.String();
            }
            return std::string{};
          } },
        { "REMOVE_FILENAME"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            return CheckPathParameters(ctx, cnt, "REMOVE_FILENAME"_s, args) &&
                !args.front().empty()
              ? cmCMakePath{ args.front() }.RemoveFileName().String()
              : std::string{};
          } },
        { "REPLACE_FILENAME"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            return CheckPathParameters(ctx, cnt, "REPLACE_FILENAME"_s, args, 2)
              ? cmCMakePath{ args[0] }
                  .ReplaceFileName(cmCMakePath{ args[1] })
                  .String()
              : std::string{};
          } },
        { "REMOVE_EXTENSION"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            bool lastOnly = args.front() == "LAST_ONLY"_s;
            if (lastOnly) {
              args.advance(1);
            }
            if (CheckPathParametersEx(ctx, cnt,
                                      lastOnly ? "REMOVE_EXTENSION,LAST_ONLY"_s
                                               : "REMOVE_EXTENSION"_s,
                                      args.size())) {
              if (args.front().empty()) {
                return std::string{};
              }
              return lastOnly
                ? cmCMakePath{ args.front() }.RemoveExtension().String()
                : cmCMakePath{ args.front() }.RemoveWideExtension().String();
            }
            return std::string{};
          } },
        { "REPLACE_EXTENSION"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            bool lastOnly = args.front() == "LAST_ONLY"_s;
            if (lastOnly) {
              args.advance(1);
            }
            if (CheckPathParametersEx(ctx, cnt,
                                      lastOnly
                                        ? "REPLACE_EXTENSION,LAST_ONLY"_s
                                        : "REPLACE_EXTENSION"_s,
                                      args.size(), 2)) {
              if (lastOnly) {
                return cmCMakePath{ args[0] }
                  .ReplaceExtension(cmCMakePath{ args[1] })
                  .String();
              }
              return cmCMakePath{ args[0] }
                .ReplaceWideExtension(cmCMakePath{ args[1] })
                .String();
            }
            return std::string{};
          } },
        { "NORMAL_PATH"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            return CheckPathParameters(ctx, cnt, "NORMAL_PATH"_s, args) &&
                !args.front().empty()
              ? cmCMakePath{ args.front() }.Normal().String()
              : std::string{};
          } },
        { "RELATIVE_PATH"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            return CheckPathParameters(ctx, cnt, "RELATIVE_PATH"_s, args, 2)
              ? cmCMakePath{ args[0] }.Relative(args[1]).String()
              : std::string{};
          } },
        { "ABSOLUTE_PATH"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            bool normalize = args.front() == "NORMALIZE"_s;
            if (normalize) {
              args.advance(1);
            }
            if (CheckPathParametersEx(ctx, cnt,
                                      normalize ? "ABSOLUTE_PATH,NORMALIZE"_s
                                                : "ABSOLUTE_PATH"_s,
                                      args.size(), 2)) {
              auto path = cmCMakePath{ args[0] }.Absolute(args[1]);
              return normalize ? path.Normal().String() : path.String();
            }
            return std::string{};
          } }
      };

    if (cm::contains(pathCommands, parameters.front())) {
      auto args = Arguments{ parameters }.advance(1);
      return pathCommands[parameters.front()](context, content, args);
    }

    reportError(context, content->GetOriginalExpression(),
                cmStrCat(parameters.front(), ": invalid option."));
    return std::string{};
  }